

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmDebugger_impl::PauseExecution(cmDebugger_impl *this)

{
  bool bVar1;
  cmDebugger_impl *this_local;
  
  std::atomic<bool>::operator=(&this->breakPending,false);
  this->breakDepth = -1;
  std::atomic<bool>::operator=(&this->continuePending,false);
  SetState(this,Paused);
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->continuePending);
  if (!bVar1) {
    std::_V2::condition_variable_any::
    wait<std::unique_lock<std::recursive_timed_mutex>,cmDebugger_impl::PauseExecution()::_lambda()_1_>
              (&this->cv,&this->Lock,(anon_class_8_1_8991fb9c)this);
  }
  SetState(this,Running);
  return;
}

Assistant:

void PauseExecution()
  {
    breakPending = false;
    breakDepth = -1;
    continuePending = false;
    SetState(State::Paused);

    if (!continuePending) {
      cv.wait(Lock, [this] { return (bool)continuePending; });
    }
    SetState(State::Running);
  }